

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec_test.cpp
# Opt level: O2

void test_single<short>(void)

{
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  write_int_to_stream<short> local_49e;
  write_int_to_stream<short> local_49c;
  write_int_to_stream<short> local_49a;
  write_int_to_stream<short> local_498;
  write_int_to_stream<short> local_496;
  write_int_to_stream<short> local_494;
  write_int_to_stream<short> local_492;
  ostringstream oss;
  ostringstream a;
  ostringstream b;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&a);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&b);
  _oss = 0x8000;
  cppcms::impl::details::write_int_to_stream<short>::operator()
            ((write_int_to_stream<short> *)&oss,(ostream *)&a);
  poVar3 = std::operator<<((ostream *)&a," ");
  local_4c0._M_dataplus._M_p._0_2_ = 0x7fff;
  cppcms::impl::details::write_int_to_stream<short>::operator()
            ((write_int_to_stream<short> *)&local_4c0,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_492.v = 1;
  cppcms::impl::details::write_int_to_stream<short>::operator()(&local_492,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_494.v = 0;
  cppcms::impl::details::write_int_to_stream<short>::operator()(&local_494,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_496.v = -1;
  cppcms::impl::details::write_int_to_stream<short>::operator()(&local_496,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_498.v = 10;
  cppcms::impl::details::write_int_to_stream<short>::operator()(&local_498,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_49a.v = -10;
  cppcms::impl::details::write_int_to_stream<short>::operator()(&local_49a,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_49c.v = 0x3039;
  cppcms::impl::details::write_int_to_stream<short>::operator()(&local_49c,poVar3);
  poVar3 = std::operator<<(poVar3," ");
  local_49e.v = -0x3039;
  cppcms::impl::details::write_int_to_stream<short>::operator()(&local_49e,poVar3);
  std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(&b,-0x8000);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x7fff);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,-1);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,10);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,-10);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x3039);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,-0x3039);
  std::operator<<(poVar3," ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                          &local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string((string *)&oss);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error!!! \n   ");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&oss);
    poVar3 = std::operator<<(poVar3,"\n   ");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&local_4c0);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &oss,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&oss);
    if (!_Var2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/todec_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x20);
      std::operator<<(poVar3," a.str() == b.str()");
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this,(string *)&local_4c0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Ok       \n   ");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&oss);
    poVar3 = std::operator<<(poVar3,"\n   ");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&local_4c0);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&oss);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&b);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&a);
  return;
}

Assistant:

void test_single()
{
	using cppcms::impl::cint;
	std::ostringstream a,b;
	a 	<< cint(std::numeric_limits<T>::min()) << " " 
		<< cint(std::numeric_limits<T>::max()) << " " 
		<< cint(T(1)) << " "
		<< cint(T(0)) << " "
		<< cint(T(-1)) << " "
		<< cint(T(10)) << " "
		<< cint(T(-10)) << " "
		<< cint(T(12345)) << " "
		<< cint(T(-12345)) << " ";
	b	<< (std::numeric_limits<T>::min()) << " " 
		<< (std::numeric_limits<T>::max()) << " " 
		<< (T(1)) << " "
		<< (T(0)) << " "
		<< (T(-1)) << " "
		<< (T(10)) << " "
		<< (T(-10)) << " "
		<< (T(12345)) << " "
		<< (T(-12345)) << " ";
	if(a.str()!=b.str()) {
		std::cerr << "Error!!! \n   " << a.str() << "\n   " << b.str() << std::endl;
		TEST(a.str() == b.str());
	}
	else {
		std::cout << "Ok       \n   " << a.str() << "\n   " << b.str() << std::endl;
	}
}